

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_matrix_t *
parasail_matrix_pssm_create_internal(char *alphabet,int *values,int length,int case_sensitive)

{
  int iVar1;
  size_t __n;
  long lVar2;
  size_t __size;
  void *pvVar3;
  int *b;
  void *__dest;
  int local_a8;
  int local_a4;
  size_t _size_3;
  size_t _size_2;
  size_t _size_1;
  size_t _size;
  int max;
  int min;
  size_t v;
  size_t c;
  size_t j;
  size_t i;
  size_t size1;
  size_t size;
  char *alphabet_copy;
  int *mapper;
  int *matrix;
  parasail_matrix_t *retval;
  int case_sensitive_local;
  int length_local;
  int *values_local;
  char *alphabet_local;
  
  v = 0;
  _max = 0;
  _size._4_4_ = 0x7fffffff;
  _size._0_4_ = -0x80000000;
  if (alphabet == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_matrix_pssm_create_internal","alphabet");
    alphabet_local = (char *)0x0;
  }
  else if (values == (int *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_matrix_pssm_create_internal","values");
    alphabet_local = (char *)0x0;
  }
  else if (length < 1) {
    fprintf(_stderr,"%s: length must be > 0\n","parasail_matrix_pssm_create_internal");
    alphabet_local = (char *)0x0;
  }
  else {
    __n = strlen(alphabet);
    if (__n < 0x7fffffff) {
      lVar2 = __n + 1;
      __size = lVar2 * length * 4;
      pvVar3 = malloc(__size);
      if (pvVar3 == (void *)0x0) {
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_pssm_create_internal",
                __size);
        alphabet_local = (char *)0x0;
      }
      else {
        for (j = 0; j < __n * (long)length; j = j + 1) {
          if (values[j] < _size._4_4_) {
            local_a4 = values[j];
          }
          else {
            local_a4 = _size._4_4_;
          }
          _size._4_4_ = local_a4;
          if ((int)_size < values[j]) {
            local_a8 = values[j];
          }
          else {
            local_a8 = (int)_size;
          }
          _size._0_4_ = local_a8;
        }
        for (j = 0; j < (ulong)(long)length; j = j + 1) {
          for (c = 0; c < __n; c = c + 1) {
            *(int *)((long)pvVar3 + v * 4) = values[_max];
            _max = _max + 1;
            v = v + 1;
          }
          *(int *)((long)pvVar3 + v * 4) = _size._4_4_;
          v = v + 1;
        }
        b = (int *)malloc(0x400);
        if (b == (int *)0x0) {
          fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_pssm_create_internal",
                  0x400);
          alphabet_local = (char *)0x0;
        }
        else {
          parasail_memset_int(b,(int)__n,0x100);
          if (case_sensitive == 0) {
            for (j = 0; j < __n; j = j + 1) {
              iVar1 = toupper((uint)(byte)alphabet[j]);
              b[iVar1] = (int)j;
              iVar1 = tolower((uint)(byte)alphabet[j]);
              b[iVar1] = (int)j;
            }
          }
          else {
            for (j = 0; j < __n; j = j + 1) {
              b[(byte)alphabet[j]] = (int)j;
            }
          }
          __dest = malloc(__n + 2);
          if (__dest == (void *)0x0) {
            fprintf(_stderr,"%s: failed to malloc %zu bytes\n",
                    "parasail_matrix_pssm_create_internal",__n + 2);
            alphabet_local = (char *)0x0;
          }
          else {
            memcpy(__dest,alphabet,__n);
            *(undefined1 *)((long)__dest + __n) = 0x2a;
            *(undefined1 *)((long)__dest + lVar2) = 0;
            alphabet_local = (char *)malloc(0x48);
            if (alphabet_local == (char *)0x0) {
              fprintf(_stderr,"%s: failed to malloc %zu bytes\n",
                      "parasail_matrix_pssm_create_internal",0x48);
              alphabet_local = (char *)0x0;
            }
            else {
              *(char **)alphabet_local = "";
              *(void **)(alphabet_local + 8) = pvVar3;
              *(int **)(alphabet_local + 0x10) = b;
              *(int *)(alphabet_local + 0x18) = (int)lVar2;
              *(int *)(alphabet_local + 0x1c) = (int)_size;
              *(int *)(alphabet_local + 0x20) = _size._4_4_;
              *(void **)(alphabet_local + 0x28) = pvVar3;
              alphabet_local[0x30] = '\x01';
              alphabet_local[0x31] = '\0';
              alphabet_local[0x32] = '\0';
              alphabet_local[0x33] = '\0';
              *(int *)(alphabet_local + 0x34) = length;
              *(void **)(alphabet_local + 0x38) = __dest;
              alphabet_local[0x40] = '\0';
              alphabet_local[0x41] = '\0';
              alphabet_local[0x42] = '\0';
              alphabet_local[0x43] = '\0';
              alphabet_local[0x44] = '\0';
              alphabet_local[0x45] = '\0';
              alphabet_local[0x46] = '\0';
              alphabet_local[0x47] = '\0';
            }
          }
        }
      }
    }
    else {
      fprintf(_stderr,"%s: alphabet is too large\n","parasail_matrix_pssm_create_internal");
      alphabet_local = (char *)0x0;
    }
  }
  return (parasail_matrix_t *)alphabet_local;
}

Assistant:

static parasail_matrix_t* parasail_matrix_pssm_create_internal(
        const char *alphabet, const int *values, const int length, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    int *mapper = NULL;
    char *alphabet_copy = NULL;
    size_t size = 0;
    size_t size1 = 0;
    size_t i = 0;
    size_t j = 0;
    size_t c = 0;
    size_t v = 0;
    int min = INT_MAX;
    int max = INT_MIN;

    PARASAIL_CHECK_NULL(alphabet);
    PARASAIL_CHECK_NULL(values);
    if (length <= 0) {
        fprintf(stderr, "%s: length must be > 0\n", __func__);
        return NULL;
    }

    size = strlen(alphabet);
    if (size >= INT_MAX) {
        fprintf(stderr, "%s: alphabet is too large\n", __func__);
        return NULL;
    }
    size1 = size + 1;

    PARASAIL_CALLOC(matrix, int, size1*length);

    /* find min and max values */
    for (i=0; i<size*length; ++i) {
        min = values[i] < min ? values[i] : min;
        max = values[i] > max ? values[i] : max;
    }

    for (i=0; i<(size_t)length; ++i) {
        for (j=0; j<size; ++j) {
            matrix[c++] = values[v++];
        }
        matrix[c++] = min;
    }

    PARASAIL_CALLOC(mapper, int, 256);
    parasail_memset_int(mapper, (int)size, 256);
    if (case_sensitive) {
        for (i=0; i<size; ++i) {
            mapper[(unsigned char)alphabet[i]] = (int)i;
        }
    }
    else {
        for (i=0; i<size; ++i) {
            mapper[toupper((unsigned char)alphabet[i])] = (int)i;
            mapper[tolower((unsigned char)alphabet[i])] = (int)i;
        }
    }

    PARASAIL_CALLOC(alphabet_copy, char, size1+1);
    (void)memcpy(alphabet_copy, alphabet, sizeof(char) * size);
    alphabet_copy[size] = '*';
    alphabet_copy[size1] = '\0';

    PARASAIL_NEW(retval, parasail_matrix_t);
    retval->name = "";
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)size1;
    retval->max = max;
    retval->min = min;
    retval->user_matrix = matrix;
    retval->type = PARASAIL_MATRIX_TYPE_PSSM;
    retval->length = length;
    retval->alphabet = alphabet_copy;
    retval->query = NULL;
    return retval;
}